

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O0

int prvTidyParseConfigFileEnc(TidyDocImpl *doc,ctmbstr file,ctmbstr charenc)

{
  uint uVar1;
  int encoding;
  Bool BVar2;
  Bool BVar3;
  ctmbstr __filename;
  TidyConfigImpl *config;
  FILE *fp;
  StreamIn *pSVar4;
  ulong uVar5;
  TidyOptionImpl *pTVar6;
  TidyConfigImpl *config_00;
  bool bVar7;
  bool bVar8;
  bool local_20cf;
  Bool local_20cc;
  Bool local_20c8;
  tchar c_1;
  Bool response;
  Bool waswhite;
  tchar delim;
  uint i;
  tmbchar buf [8192];
  TidyConfigImpl *cfg_1;
  TidyOptionImpl *option;
  tmbchar local_98 [4];
  Bool isDeprecated;
  tmbchar name [64];
  tchar local_50;
  uint ix;
  tchar c;
  int enc;
  FILE *fin;
  TidyConfigImpl *cfg;
  tmbstr fname;
  uint opterrs;
  ctmbstr charenc_local;
  ctmbstr file_local;
  TidyDocImpl *doc_local;
  
  uVar1 = doc->optionErrors;
  __filename = ExpandTilde(doc,file);
  config = &doc->config;
  fp = fopen(__filename,"r");
  encoding = prvTidyCharEncodingId(doc,charenc);
  if ((fp == (FILE *)0x0) || (encoding < 0)) {
    prvTidyReportFileError(doc,__filename,0x23e);
    doc_local._4_4_ = 0xffffffff;
  }
  else {
    pSVar4 = prvTidyFileInput(doc,(FILE *)fp,encoding);
    (doc->config).cfgIn = pSVar4;
    FirstChar(config);
    local_50 = SkipWhite(config);
LAB_00162d56:
    if (local_50 != 0xffffffff) {
      name[0x3c] = '\0';
      name[0x3d] = '\0';
      name[0x3e] = '\0';
      name[0x3f] = '\0';
      memset(local_98,0,0x40);
      if ((local_50 != 0x2f) && (local_50 != 0x23)) {
        while( true ) {
          bVar7 = false;
          if (((uint)name._60_4_ < 0x3f) &&
             ((bVar7 = false, local_50 != 10 && (bVar7 = false, local_50 != 0xffffffff)))) {
            bVar7 = local_50 != 0x3a;
          }
          if (!bVar7) break;
          uVar5 = (ulong)(uint)name._60_4_;
          name._60_4_ = name._60_4_ + 1;
          local_98[uVar5] = (tmbchar)local_50;
          local_50 = AdvanceChar(config);
        }
        if (local_50 == 0x3a) {
          BVar2 = isOptionDeprecated(local_98);
          pTVar6 = prvTidylookupOption(local_98);
          AdvanceChar(config);
          if ((pTVar6 == (TidyOptionImpl *)0x0) || (BVar2 != no)) {
            if ((doc->pOptCallback != (TidyOptCallback)0x0) ||
               ((doc->pConfigCallback != (TidyConfigCallback)0x0 || (BVar2 != no)))) {
              config_00 = &doc->config;
              waswhite = no;
              response = no;
              bVar7 = true;
              local_20c8 = no;
              BVar3 = SkipWhite(config_00);
              if ((BVar3 == 0x22) || (local_20cc = BVar3, BVar3 == 0x27)) {
                local_20cc = AdvanceChar(config_00);
                response = BVar3;
              }
LAB_00162f0d:
              do {
                bVar8 = false;
                if (((waswhite < 0x1ffe) && (bVar8 = false, local_20cc != ~no)) &&
                   (bVar8 = false, local_20cc != 0xd)) {
                  bVar8 = local_20cc != 10;
                }
                if ((!bVar8) || ((response != no && (local_20cc == response)))) goto LAB_00162fff;
                BVar3 = prvTidyIsWhite(local_20cc);
                if (BVar3 == no) {
                  bVar7 = false;
                }
                else {
                  if (bVar7) {
                    local_20cc = AdvanceChar(config_00);
                    goto LAB_00162f0d;
                  }
                  local_20cc = 0x20;
                }
                *(char *)((long)&delim + (ulong)waswhite) = (char)local_20cc;
                local_20cc = AdvanceChar(config_00);
                waswhite = waswhite + yes;
              } while( true );
            }
            prvTidyReportUnknownOption(doc,local_98);
          }
          else {
            (*pTVar6->parser)(doc,pTVar6);
          }
        }
      }
      goto LAB_001630f7;
    }
    prvTidyfreeFileSource(&((doc->config).cfgIn)->source,yes);
    prvTidyfreeStreamIn((doc->config).cfgIn);
    (doc->config).cfgIn = (StreamIn *)0x0;
    if (__filename != file) {
      (*doc->allocator->vtbl->free)(doc->allocator,__filename);
    }
    doc_local._4_4_ = (uint)(uVar1 < doc->optionErrors);
  }
  return doc_local._4_4_;
LAB_00162fff:
  *(undefined1 *)((long)&delim + (ulong)waswhite) = 0;
  if (doc->pOptCallback != (TidyOptCallback)0x0) {
    local_20c8 = (*doc->pOptCallback)(local_98,(ctmbstr)&delim);
  }
  if (doc->pConfigCallback != (TidyConfigCallback)0x0) {
    local_20cf = true;
    if (local_20c8 == no) {
      BVar3 = (*doc->pConfigCallback)((TidyDoc)doc,local_98,(ctmbstr)&delim);
      local_20cf = BVar3 != no;
    }
    local_20c8 = (Bool)local_20cf;
  }
  if ((local_20c8 == no) && (BVar2 != no)) {
    local_20c8 = subDeprecatedOption(doc,local_98,(ctmbstr)&delim);
  }
  if (local_20c8 == no) {
    prvTidyReportUnknownOption(doc,local_98);
  }
LAB_001630f7:
  local_50 = NextProperty(config);
  goto LAB_00162d56;
}

Assistant:

int TY_(ParseConfigFileEnc)( TidyDocImpl* doc, ctmbstr file, ctmbstr charenc )
{
    enum { tidy_max_name = 64 };
    uint opterrs = doc->optionErrors;
    tmbstr fname = (tmbstr) ExpandTilde( doc, file );
    TidyConfigImpl* cfg = &doc->config;
    FILE* fin = fopen( fname, "r" );
    int enc = TY_(CharEncodingId)( doc, charenc );

    if ( fin == NULL || enc < 0 )
    {
        TY_(ReportFileError)( doc, fname, FILE_CANT_OPEN_CFG );
        return -1;
    }
    else
    {
        tchar c;
        cfg->cfgIn = TY_(FileInput)( doc, fin, enc );
        c = FirstChar( cfg );
       
        for ( c = SkipWhite(cfg); c != EndOfStream; c = NextProperty(cfg) )
        {
            uint ix = 0;
            tmbchar name[ tidy_max_name ] = {0};

            /* // or # start a comment */
            if ( c == '/' || c == '#' )
                continue;

            while ( ix < sizeof(name)-1 && c != '\n' && c != EndOfStream && c != ':' )
            {
                name[ ix++ ] = (tmbchar) c;  /* Option names all ASCII */
                c = AdvanceChar( cfg );
            }

            if ( c == ':' )
            {
                Bool isDeprecated = isOptionDeprecated( name );
                const TidyOptionImpl* option = TY_(lookupOption)( name );
                c = AdvanceChar( cfg );
                if ( option && !isDeprecated )
                    option->parser( doc, option );
                else
                {
                    if ( (NULL != doc->pOptCallback) || (NULL != doc->pConfigCallback) || isDeprecated )
                    {
                        TidyConfigImpl* cfg = &doc->config;
                        tmbchar buf[8192];
                        uint i = 0;
                        tchar delim = 0;
                        Bool waswhite = yes;
                        Bool response = no;

                        tchar c = SkipWhite( cfg );

                        if ( c == '"' || c == '\'' )
                        {
                            delim = c;
                            c = AdvanceChar( cfg );
                        }

                        while ( i < sizeof(buf)-2 && c != EndOfStream && c != '\r' && c != '\n' )
                        {
                            if ( delim && c == delim )
                                break;

                            if ( TY_(IsWhite)(c) )
                            {
                                if ( waswhite )
                                {
                                    c = AdvanceChar( cfg );
                                    continue;
                                }
                                c = ' ';
                            }
                            else
                                waswhite = no;

                            buf[i++] = (tmbchar) c;
                            c = AdvanceChar( cfg );
                        }
                        buf[i] = '\0';
                        
                        if ( doc->pOptCallback )
                            response = (*doc->pOptCallback)( name, buf );

                        if ( doc->pConfigCallback )
                            response = response || (*doc->pConfigCallback)( tidyImplToDoc(doc), name, buf );

                        if ( !response && isDeprecated )
                            response = subDeprecatedOption( doc, name, buf);

                        if ( response == no )
                            TY_(ReportUnknownOption)( doc, name );
                    }
                    else
                        TY_(ReportUnknownOption)( doc, name );
                }
            }
        }

        TY_(freeFileSource)(&cfg->cfgIn->source, yes);
        TY_(freeStreamIn)( cfg->cfgIn );
        cfg->cfgIn = NULL;
    }

    if ( fname != (tmbstr) file )
        TidyDocFree( doc, fname );

    /* @jsd: do NOT mess with user-specified settings until
     *       absolutely necessary, and ensure that we can
     *       can restore them immediately after the need.
     */
    // TY_(AdjustConfig)( docTo );  /* Make sure it's consistent */

    /* any new config errors? If so, return warning status. */
    return (doc->optionErrors > opterrs ? 1 : 0); 
}